

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileiconprovider.cpp
# Opt level: O3

QIcon __thiscall QFileIconProvider::icon(QFileIconProvider *this,IconType type)

{
  uint in_EDX;
  undefined4 in_register_00000034;
  
  if (in_EDX < 7) {
    switch(in_EDX) {
    case 0:
      break;
    case 1:
      break;
    case 2:
      break;
    case 3:
      break;
    case 4:
      break;
    case 5:
      break;
    case 6:
    }
    QFileIconProviderPrivate::getIcon
              ((QFileIconProviderPrivate *)this,
               (StandardPixmap)*(undefined8 *)(CONCAT44(in_register_00000034,type) + 8));
  }
  else {
    QIcon::QIcon((QIcon *)this);
  }
  return (QIcon)(QIconPrivate *)this;
}

Assistant:

QIcon QFileIconProvider::icon(IconType type) const
{
    Q_D(const QFileIconProvider);
    switch (type) {
    case Computer:
        return d->getIcon(QStyle::SP_ComputerIcon);
    case Desktop:
        return d->getIcon(QStyle::SP_DesktopIcon);
    case Trashcan:
        return d->getIcon(QStyle::SP_TrashIcon);
    case Network:
        return d->getIcon(QStyle::SP_DriveNetIcon);
    case Drive:
        return d->getIcon(QStyle::SP_DriveHDIcon);
    case Folder:
        return d->getIcon(QStyle::SP_DirIcon);
    case File:
        return d->getIcon(QStyle::SP_FileIcon);
    default:
        break;
    };
    return QIcon();
}